

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,unsigned_long>>>
::find_or_prepare_insert<void*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,unsigned_long>>>
          *this,void **key)

{
  AssertHashEqConsistent<void*>(this,key);
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              *)this);
  if (*(long *)this == 1) {
    find_or_prepare_insert_soo<void*>(__return_storage_ptr__,this,key);
  }
  else {
    if (*(long *)this == 0) {
      __assert_fail("cap >= kDefaultCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xb75,
                    "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, absl::container_internal::HashEq<void *>::Hash, absl::container_internal::HashEq<void *>::Eq, std::allocator<std::pair<void *const, unsigned long>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, Hash = absl::container_internal::HashEq<void *>::Hash, Eq = absl::container_internal::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, unsigned long>>]"
                   );
    }
    find_or_prepare_insert_non_soo<void*>(__return_storage_ptr__,this,key);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert(const K& key) {
    AssertOnFind(key);
    if (is_soo()) return find_or_prepare_insert_soo(key);
    return find_or_prepare_insert_non_soo(key);
  }